

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall LinearScan::CheckOpHelper(LinearScan *this,Instr *instr)

{
  RealCount *pRVar1;
  Iterator *this_00;
  char cVar2;
  RegNum RVar3;
  byte bVar4;
  OpCode OVar5;
  ushort uVar6;
  uint uVar7;
  Instr *pIVar8;
  Lifetime *lifetime;
  OpHelperBlock *pOVar9;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *pSVar10;
  code *pcVar11;
  bool bVar12;
  uint32 uVar13;
  uint32 helperSpilledLiveranges;
  uint uVar14;
  undefined4 *puVar15;
  Type *ppLVar16;
  Type pSVar17;
  PragmaInstr *instr_00;
  Type *pTVar18;
  char *message;
  SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *pSVar19;
  char *error;
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *this_01;
  undefined1 uVar20;
  Instr *local_48;
  
  if ((this->currentOpHelperBlock != (OpHelperBlock *)0x0) &&
     (this->currentOpHelperBlock->opHelperEndInstr == instr)) {
    if (instr->m_kind == InstrKindBranch) {
      OVar5 = instr->m_opcode;
      if (OVar5 < ADD) {
        bVar12 = OVar5 == MultiBr || OVar5 == Br;
      }
      else {
        bVar12 = LowererMD::IsUnconditionalBranch(instr);
      }
      if (bVar12 == false) goto LAB_00586209;
      if (instr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar12) goto LAB_00586704;
        *puVar15 = 0;
      }
      pIVar8 = instr[1].m_next;
      cVar2 = *(char *)((long)&instr[1]._vptr_Instr + 1);
      if (pIVar8 == (Instr *)0x0) {
        if (cVar2 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar15 = 1;
          error = "(m_isMultiBranch)";
          message = "m_isMultiBranch";
          uVar14 = 0x20e;
          goto LAB_00586266;
        }
      }
      else if (cVar2 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        error = "(!m_isMultiBranch)";
        message = "!m_isMultiBranch";
        uVar14 = 0x209;
LAB_00586266:
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,uVar14,error,message);
        if (!bVar12) goto LAB_00586704;
        *puVar15 = 0;
      }
      if (pIVar8 == (Instr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                            ,0x23f,"(!instr->AsBranchInstr()->IsMultiBranch())",
                            "Not supported for Multibranch");
        if (!bVar12) goto LAB_00586704;
        *puVar15 = 0;
      }
      if (instr->m_kind != InstrKindBranch) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                            ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
        if (!bVar12) goto LAB_00586704;
        *puVar15 = 0;
      }
      local_48 = instr[1].m_next;
    }
    else {
LAB_00586209:
      local_48 = (Instr *)0x0;
    }
    helperSpilledLiveranges = 0;
    this_01 = this->opHelperSpilledLiveranges;
    if ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
        (this_01->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next != this_01) {
      puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      helperSpilledLiveranges = 0;
      do {
        ppLVar16 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Head
                             (&this_01->
                               super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>);
        lifetime = *ppLVar16;
        SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
                  (&this_01->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>,
                   this_01->allocator);
        uVar6 = *(ushort *)&lifetime->field_0x9c;
        *(ushort *)&lifetime->field_0x9c = uVar6 & 0xffef;
        if ((uVar6 & 0x40) == 0) {
          AssignActiveReg(this,lifetime,lifetime->reg);
          uVar20 = 1;
          if (local_48 == (Instr *)0x0) {
LAB_005864b5:
            RVar3 = lifetime->reg;
            bVar4 = lifetime->field_0x9c;
            helperSpilledLiveranges = helperSpilledLiveranges + 1;
            pOVar9 = this->currentOpHelperBlock;
            pSVar17 = (Type)new<Memory::ArenaAllocator>
                                      (0x18,(pOVar9->spilledLifetime).allocator,0x366bee);
            pSVar17[1].next = (Type)lifetime;
            *(RegNum *)&pSVar17[2].next = RVar3;
            *(byte *)((long)&pSVar17[2].next + 1) = bVar4 >> 5 & 1;
            *(undefined1 *)((long)&pSVar17[2].next + 2) = uVar20;
            pSVar17->next =
                 (pOVar9->spilledLifetime).
                 super_SListBase<OpHelperSpilledLifetime,_Memory::ArenaAllocator,_RealCount>.
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
            (pOVar9->spilledLifetime).
            super_SListBase<OpHelperSpilledLifetime,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar17;
            pRVar1 = &(pOVar9->spilledLifetime).
                      super_SListBase<OpHelperSpilledLifetime,_Memory::ArenaAllocator,_RealCount>.
                      super_RealCount;
            pRVar1->count = pRVar1->count + 1;
            bVar12 = true;
          }
          else {
            uVar7 = lifetime->end;
            uVar13 = IR::Instr::GetNumber(local_48);
            uVar20 = 1;
            if (uVar13 <= uVar7) goto LAB_005864b5;
            if ((lifetime->field_0x9c & 0x20) != 0) {
              uVar20 = 0;
              goto LAB_005864b5;
            }
            if (instr->m_kind != InstrKindBranch) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar12 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                  ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
              if (!bVar12) goto LAB_00586704;
              *puVar15 = 0;
            }
            bVar12 = IR::BranchInstr::IsLoopTail((BranchInstr *)instr,this->func);
            if (bVar12) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar12 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                                  ,0x265,"(!instr->AsBranchInstr()->IsLoopTail(this->func))",
                                  "!instr->AsBranchInstr()->IsLoopTail(this->func)");
              if (!bVar12) goto LAB_00586704;
              *puVar15 = 0;
            }
            bVar12 = false;
          }
          if (bVar12) goto LAB_00586521;
        }
        else {
          *(ushort *)&lifetime->field_0x9c = uVar6 & 0xffaf;
LAB_00586521:
          lifetime->field_0x9c = lifetime->field_0x9c & 0xdf;
        }
        this_01 = this->opHelperSpilledLiveranges;
      } while ((SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)
               (this_01->super_SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next != this_01);
    }
    uVar14 = OpHelperBlock::Length(this->currentOpHelperBlock);
    this->totalOpHelperFullVisitedLength = this->totalOpHelperFullVisitedLength + uVar14;
    instr_00 = IR::PragmaInstr::New(Nop,0,this->func);
    IR::Instr::InsertBefore(this->currentOpHelperBlock->opHelperEndInstr,&instr_00->super_Instr);
    uVar13 = IR::Instr::GetNumber(this->currentOpHelperBlock->opHelperEndInstr);
    IR::Instr::SetNumber(&instr_00->super_Instr,uVar13);
    this->currentOpHelperBlock->opHelperEndInstr = &instr_00->super_Instr;
    (this->opHelperSpilledRegs).word = 0;
    this->currentOpHelperBlock = (OpHelperBlock *)0x0;
    LinearScanMD::EndOfHelperBlock(&this->linearScanMD,helperSpilledLiveranges);
  }
  pSVar10 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
            (this->opHelperBlockIter).current;
  if ((pSVar10 != (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
     (pSVar10 != (this->opHelperBlockIter).list)) {
    this_00 = &this->opHelperBlockIter;
    if (((instr->m_kind == InstrKindProfiledLabel) || (instr->m_kind == InstrKindLabel)) &&
       (((ulong)instr[1].m_func & 2) != 0)) {
      pTVar18 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(this_00)
      ;
      if (pTVar18->opHelperLabel != (LabelInstr *)instr) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                            ,0x29a,
                            "(!instr->IsLabelInstr() || !instr->AsLabelInstr()->isOpHelper || this->opHelperBlockIter.Data().opHelperLabel == instr)"
                            ,
                            "Found a helper label that doesn\'t begin the next helper block in the list?"
                           );
        if (!bVar12) goto LAB_00586704;
        *puVar15 = 0;
      }
    }
    pTVar18 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(this_00);
    if (pTVar18->opHelperLabel == (LabelInstr *)instr) {
      pTVar18 = SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(this_00)
      ;
      this->currentOpHelperBlock = pTVar18;
      if ((this->opHelperBlockIter).current == (NodeBase *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar15 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar15 = 1;
        bVar12 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                            ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar12) {
LAB_00586704:
          pcVar11 = (code *)invalidInstructionException();
          (*pcVar11)();
        }
        *puVar15 = 0;
      }
      pSVar10 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)
                ((this->opHelperBlockIter).current)->next;
      pSVar19 = (SListBase<OpHelperBlock,_Memory::ArenaAllocator,_RealCount> *)0x0;
      if (pSVar10 != (this->opHelperBlockIter).list) {
        pSVar19 = pSVar10;
      }
      (this->opHelperBlockIter).current = &pSVar19->super_SListNodeBase<Memory::ArenaAllocator>;
    }
  }
  return;
}

Assistant:

void
LinearScan::CheckOpHelper(IR::Instr *instr)
{
    if (this->IsInHelperBlock())
    {
        if (this->currentOpHelperBlock->opHelperEndInstr == instr)
        {
            // Get targetInstr if we can.
            // We can deterministically get it only for unconditional branches, as conditional branch may fall through.
            IR::Instr * targetInstr = nullptr;
            if (instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional())
            {
                AssertMsg(!instr->AsBranchInstr()->IsMultiBranch(), "Not supported for Multibranch");
                targetInstr = instr->AsBranchInstr()->GetTarget();
            }

            /*
             * Keep track of the number of registers we've had to
             * store and restore around a helper block for LinearScanMD (on ARM
             * and X64). We need this to be able to allocate space in the frame.
             * We can't emit a PUSH/POP sequence around the block like IA32 because
             * the stack pointer can't move outside the prolog.
             */
            uint32 helperSpilledLiverangeCount = 0;

            // Exiting a helper block.  We are going to insert
            // the restore here after linear scan.  So put all the restored
            // lifetime back to active
            while (!this->opHelperSpilledLiveranges->Empty())
            {
                Lifetime * lifetime = this->opHelperSpilledLiveranges->Pop();
                lifetime->isOpHelperSpilled = false;

                if (!lifetime->cantOpHelperSpill)
                {
                    // Put the life time back to active
                    this->AssignActiveReg(lifetime, lifetime->reg);
                    bool reload = true;
                    // Lifetime ends before the target after helper block, don't need to save and restore helper spilled lifetime.
                    if (targetInstr && lifetime->end < targetInstr->GetNumber())
                    {
                        // However, if lifetime is spilled as arg - we still need to spill it because the helper assumes the value
                        // to be available in the stack
                        if (lifetime->isOpHelperSpillAsArg)
                        {
                            // we should not attempt to restore it as it is dead on return from the helper.
                            reload = false;
                        }
                        else
                        {
                            Assert(!instr->AsBranchInstr()->IsLoopTail(this->func));
                            continue;
                        }
                    }

                    // Save all the lifetime that needs to be restored
                    OpHelperSpilledLifetime spilledLifetime;
                    spilledLifetime.lifetime = lifetime;
                    spilledLifetime.spillAsArg = lifetime->isOpHelperSpillAsArg;
                    spilledLifetime.reload = reload;
                    /*
                     * Can't unfortunately move this into the else block above because we don't know if this
                     * lifetime will actually get spilled until register allocation completes.
                     * Instead we allocate a slot to this StackSym in LinearScanMD iff
                     * !(lifetime.isSpilled && lifetime.noReloadsIfSpilled).
                     */
                    helperSpilledLiverangeCount++;

                    // save the reg in case it is spilled later.  We still need to save and restore
                    // for the non-loop case.
                    spilledLifetime.reg = lifetime->reg;
                    this->currentOpHelperBlock->spilledLifetime.Prepend(spilledLifetime);
                }
                else
                {
                    // Clear it for the next helper block
                    lifetime->cantOpHelperSpill = false;
                }
                lifetime->isOpHelperSpillAsArg = false;
            }

            this->totalOpHelperFullVisitedLength += this->currentOpHelperBlock->Length();

            // Use a dummy label as the insertion point of the reloads, as second-chance-allocation
            // may insert compensation code right before the branch
            IR::PragmaInstr *dummyLabel = IR::PragmaInstr::New(Js::OpCode::Nop, 0, this->func);
            this->currentOpHelperBlock->opHelperEndInstr->InsertBefore(dummyLabel);
            dummyLabel->CopyNumber(this->currentOpHelperBlock->opHelperEndInstr);
            this->currentOpHelperBlock->opHelperEndInstr = dummyLabel;

            this->opHelperSpilledRegs.ClearAll();
            this->currentOpHelperBlock = nullptr;

            linearScanMD.EndOfHelperBlock(helperSpilledLiverangeCount);
        }
    }

    if (this->opHelperBlockIter.IsValid())
    {
        AssertMsg(
            !instr->IsLabelInstr() ||
            !instr->AsLabelInstr()->isOpHelper ||
            this->opHelperBlockIter.Data().opHelperLabel == instr,
            "Found a helper label that doesn't begin the next helper block in the list?");

        if (this->opHelperBlockIter.Data().opHelperLabel == instr)
        {
            this->currentOpHelperBlock = &this->opHelperBlockIter.Data();
            this->opHelperBlockIter.Next();
        }
    }
}